

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O2

Node * __thiscall Parser::parseUnaryOp(Parser *this)

{
  Token *t;
  int iVar1;
  Node *pNVar2;
  socklen_t *in_RCX;
  sockaddr *in_RDX;
  sockaddr *__addr;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  sockaddr *__addr_02;
  sockaddr *__addr_03;
  sockaddr *__addr_04;
  sockaddr *__addr_05;
  sockaddr *__addr_06;
  
  iVar1 = accept(this,0xb,in_RDX,in_RCX);
  if ((char)iVar1 == '\0') {
    iVar1 = accept(this,10,__addr,in_RCX);
    if ((char)iVar1 == '\0') {
      iVar1 = accept(this,0xf,__addr_00,in_RCX);
      if ((char)iVar1 == '\0') {
        iVar1 = accept(this,0xe,__addr_01,in_RCX);
        if ((char)iVar1 == '\0') {
          iVar1 = accept(this,0x15,__addr_02,in_RCX);
          if ((char)iVar1 == '\0') {
            iVar1 = accept(this,0x16,__addr_03,in_RCX);
            if ((char)iVar1 == '\0') {
              iVar1 = accept(this,0x4a,__addr_04,in_RCX);
              if ((char)iVar1 == '\0') {
                iVar1 = accept(this,0x3c,__addr_05,in_RCX);
                if ((char)iVar1 == '\0') {
                  iVar1 = accept(this,0x47,__addr_06,in_RCX);
                  if ((char)iVar1 == '\0') {
                    pNVar2 = parseReaderMacro(this);
                    return pNVar2;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  t = this->tok;
  pNVar2 = parseUnaryOp(this);
  pNVar2 = createUnaryPreOpNode(this,t,pNVar2);
  return pNVar2;
}

Assistant:

Node * parseUnaryOp()
  {
    if (accept(TK_MINUS) || accept(TK_PLUS) || accept(TK_INV) || accept(TK_NOT) || accept(TK_PLUSPLUS) || accept(TK_MINUSMINUS) ||
      accept(TK_TYPEOF) || accept(TK_DELETE) || accept(TK_CLONE))
    {
      Token & opToken = *tok;
      return createUnaryPreOpNode(opToken, parseUnaryOp());
    }
    else
    {
      return parseReaderMacro();
    }
  }